

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_cell_t::assign_filtration
          (delta_complex_cell_t *this,char *filter,delta_complex_t *complex)

{
  pointer plVar1;
  bool bVar2;
  int iVar3;
  index_t iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference plVar8;
  reference ppVar9;
  reference pvVar10;
  size_type *psVar11;
  reference pvVar12;
  ulong uVar13;
  float *pfVar14;
  int *piVar15;
  ostream *this_00;
  value_t vVar16;
  double dVar17;
  int local_188;
  value_t local_184;
  int local_180;
  float local_17c;
  int i_12;
  value_t max_face_1;
  long i_11;
  iterator __end11;
  iterator __begin11;
  vector<long,_std::allocator<long>_> *__range11;
  int x_2;
  int j_2;
  int i_10;
  vector<long,_std::allocator<long>_> degrees_2;
  int local_128;
  float local_124;
  int i_9;
  value_t max_face;
  long i_8;
  iterator __end10;
  iterator __begin10;
  vector<long,_std::allocator<long>_> *__range10;
  int x_1;
  int j_1;
  int i_7;
  vector<long,_std::allocator<long>_> degrees_1;
  int local_d0;
  int n_1;
  int i_6;
  value_t m_4;
  float local_c0;
  int i_5;
  value_t m_3;
  float local_b4;
  int i_4;
  value_t m_2;
  int i_3;
  value_t m_1;
  pair<const_long,_int> i_2;
  iterator __end4_1;
  iterator __begin4_1;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *__range4_1;
  value_t m;
  int n;
  long i_1;
  iterator __end4;
  iterator __begin4;
  vector<long,_std::allocator<long>_> *__range4;
  int x;
  int j;
  int i;
  allocator<long> local_39;
  undefined1 local_38 [8];
  vector<long,_std::allocator<long>_> degrees;
  delta_complex_t *complex_local;
  char *filter_local;
  delta_complex_cell_t *this_local;
  
  degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)complex;
  iVar3 = strcmp(filter,"local");
  if (iVar3 == 0) {
    iVar4 = dimension(this);
    if (iVar4 == 0) {
      this->filt = 0.0;
    }
    else {
      iVar4 = dimension(this);
      if (iVar4 == 1) {
        this->filt = 2.0;
      }
      else {
        sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices);
        std::allocator<long>::allocator(&local_39);
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)local_38,sVar5,&local_39);
        std::allocator<long>::~allocator(&local_39);
        for (x = 0; sVar5 = std::
                            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ::size(&this->orientation), (ulong)(long)x < sVar5; x = x + 1) {
          __range4._4_4_ = 0;
          while( true ) {
            pvVar6 = std::
                     vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ::operator[](&this->orientation,(long)x);
            sVar5 = std::vector<long,_std::allocator<long>_>::size(pvVar6);
            if (sVar5 <= (ulong)(long)__range4._4_4_) break;
            pvVar6 = std::
                     vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ::operator[](&this->orientation,(long)x);
            pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                               (pvVar6,(long)__range4._4_4_);
            if (*pvVar7 == 0) {
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 ((vector<long,_std::allocator<long>_> *)local_38,(long)(x + 1));
              *pvVar7 = *pvVar7 + 1;
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 ((vector<long,_std::allocator<long>_> *)local_38,
                                  (long)__range4._4_4_);
              *pvVar7 = *pvVar7 + -1;
            }
            else {
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 ((vector<long,_std::allocator<long>_> *)local_38,(long)(x + 1));
              *pvVar7 = *pvVar7 + -1;
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 ((vector<long,_std::allocator<long>_> *)local_38,
                                  (long)__range4._4_4_);
              *pvVar7 = *pvVar7 + 1;
            }
            __range4._4_4_ = __range4._4_4_ + 1;
          }
        }
        __range4._0_4_ = 0;
        __end4 = std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)local_38);
        i_1 = (long)std::vector<long,_std::allocator<long>_>::end
                              ((vector<long,_std::allocator<long>_> *)local_38);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                           *)&i_1), bVar2) {
          plVar8 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&__end4);
          dVar17 = pow((double)*plVar8,2.0);
          __range4._0_4_ = (int)((double)(int)__range4 + dVar17);
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&__end4);
        }
        iVar4 = dimension(this);
        iVar3 = (int)iVar4;
        this->filt = (float)(((iVar3 + 1) * iVar3 * (iVar3 + -1)) / 3 + (int)__range4);
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)local_38);
      }
    }
  }
  else {
    iVar3 = strcmp(filter,"global");
    if (iVar3 == 0) {
      iVar4 = dimension(this);
      if (iVar4 == 0) {
        __range4_1._0_4_ = 0.0;
        __end4_1 = std::
                   unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                   ::begin(&this->in_or_out);
        i_2._8_8_ = std::
                    unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                    ::end(&this->in_or_out);
        while (bVar2 = std::__detail::operator!=
                                 (&__end4_1.
                                   super__Node_iterator_base<std::pair<const_long,_int>,_false>,
                                  (_Node_iterator_base<std::pair<const_long,_int>,_false> *)
                                  &i_2.second), bVar2) {
          ppVar9 = std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::
                   operator*(&__end4_1);
          _i_3 = ppVar9->first;
          i_2.first = *(long *)&ppVar9->second;
          if ((int)i_2.first == 0) {
            __range4_1._0_4_ = __range4_1._0_4_ + 1.0;
          }
          else if ((int)i_2.first == 1) {
            __range4_1._0_4_ = __range4_1._0_4_ - 1.0;
          }
          std::__detail::_Node_iterator<std::pair<const_long,_int>,_false,_false>::operator++
                    (&__end4_1);
        }
        dVar17 = pow((double)__range4_1._0_4_,2.0);
        this->filt = (float)dVar17;
      }
      else {
        iVar4 = dimension(this);
        if (0 < iVar4) {
          pvVar10 = std::
                    vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                    ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                  *)degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,0);
          psVar11 = (size_type *)
                    std::vector<long,_std::allocator<long>_>::operator[](&this->vertices,0);
          pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                    operator[](pvVar10,*psVar11);
          m_2 = filtration(pvVar12);
          for (i_4 = 1; uVar13 = (ulong)i_4,
              sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices),
              uVar13 < sVar5; i_4 = i_4 + 1) {
            pvVar10 = std::
                      vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                    *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            psVar11 = (size_type *)
                      std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->vertices,(long)i_4);
            pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                      operator[](pvVar10,*psVar11);
            vVar16 = filtration(pvVar12);
            m_2 = vVar16 + m_2;
          }
          this->filt = m_2;
        }
      }
    }
    else {
      iVar3 = strcmp(filter,"vertexMax");
      if (iVar3 == 0) {
        iVar4 = dimension(this);
        if (0 < iVar4) {
          pvVar10 = std::
                    vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                    ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                  *)degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,0);
          psVar11 = (size_type *)
                    std::vector<long,_std::allocator<long>_>::operator[](&this->vertices,0);
          pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                    operator[](pvVar10,*psVar11);
          local_b4 = filtration(pvVar12);
          for (m_3 = 1.4013e-45; uVar13 = (ulong)(int)m_3,
              sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices),
              uVar13 < sVar5; m_3 = (value_t)((int)m_3 + 1)) {
            pvVar10 = std::
                      vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                    *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            psVar11 = (size_type *)
                      std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->vertices,(long)(int)m_3);
            pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                      operator[](pvVar10,*psVar11);
            i_5 = (int)filtration(pvVar12);
            pfVar14 = std::max<float>(&local_b4,(float *)&i_5);
            local_b4 = *pfVar14;
          }
          this->filt = local_b4;
        }
      }
      else {
        iVar3 = strcmp(filter,"edgeMax");
        if (iVar3 == 0) {
          iVar4 = dimension(this);
          if (1 < iVar4) {
            pvVar10 = std::
                      vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                      ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                    *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,1);
            psVar11 = (size_type *)
                      std::vector<long,_std::allocator<long>_>::operator[](&this->vertices,0);
            pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                      operator[](pvVar10,*psVar11);
            local_c0 = filtration(pvVar12);
            for (m_4 = 1.4013e-45; uVar13 = (ulong)(int)m_4,
                sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices),
                uVar13 < sVar5; m_4 = (value_t)((int)m_4 + 1)) {
              pvVar10 = std::
                        vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                      *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,1);
              psVar11 = (size_type *)
                        std::vector<long,_std::allocator<long>_>::operator[]
                                  (&this->vertices,(long)(int)m_4);
              pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                        operator[](pvVar10,*psVar11);
              i_6 = (int)filtration(pvVar12);
              pfVar14 = std::max<float>(&local_c0,(float *)&i_6);
              local_c0 = *pfVar14;
            }
            this->filt = local_c0;
          }
        }
        else {
          iVar3 = strcmp(filter,"vertexSum");
          if (iVar3 == 0) {
            iVar4 = dimension(this);
            if (0 < iVar4) {
              pvVar10 = std::
                        vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                      *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              psVar11 = (size_type *)
                        std::vector<long,_std::allocator<long>_>::operator[](&this->vertices,0);
              pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                        operator[](pvVar10,*psVar11);
              n_1 = (int)filtration(pvVar12);
              for (local_d0 = 1;
                  sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices),
                  (ulong)(long)local_d0 < sVar5; local_d0 = local_d0 + 1) {
                pvVar10 = std::
                          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                        *)degrees.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
                psVar11 = (size_type *)
                          std::vector<long,_std::allocator<long>_>::operator[]
                                    (&this->vertices,(long)local_d0);
                pvVar12 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                          operator[](pvVar10,*psVar11);
                vVar16 = filtration(pvVar12);
                n_1 = (int)(vVar16 + (float)n_1);
              }
              this->filt = (value_t)n_1;
            }
          }
          else {
            iVar3 = strcmp(filter,"3cycle");
            if (iVar3 == 0) {
              iVar4 = dimension(this);
              if (iVar4 == 0) {
                this->filt = 0.0;
              }
              else {
                iVar4 = dimension(this);
                if (iVar4 == 1) {
                  this->filt = 0.0;
                }
                else {
                  assign_filtration(this,"local",
                                    (delta_complex_t *)
                                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                  iVar4 = dimension(this);
                  degrees_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)iVar4 + 1;
                  iVar3 = binom(degrees_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_,3);
                  this->filt = ((float)(iVar3 * ((degrees_1.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_ * 4 + -2) /
                                                (degrees_1.
                                                 super__Vector_base<long,_std::allocator<long>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_ + -2))) - this->filt) / 8.0;
                }
              }
            }
            else {
              iVar3 = strcmp(filter,"natural");
              if (iVar3 == 0) {
                iVar4 = dimension(this);
                if (iVar4 == 0) {
                  this->filt = 0.0;
                }
                else {
                  iVar4 = dimension(this);
                  if (iVar4 == 1) {
                    this->filt = 2.0;
                  }
                  else {
                    sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices);
                    std::allocator<long>::allocator((allocator<long> *)((long)&j_1 + 3));
                    std::vector<long,_std::allocator<long>_>::vector
                              ((vector<long,_std::allocator<long>_> *)&i_7,sVar5,
                               (allocator<long> *)((long)&j_1 + 3));
                    std::allocator<long>::~allocator((allocator<long> *)((long)&j_1 + 3));
                    for (x_1 = 0; sVar5 = std::
                                          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                          ::size(&this->orientation), (ulong)(long)x_1 < sVar5;
                        x_1 = x_1 + 1) {
                      __range10._4_4_ = 0;
                      while( true ) {
                        pvVar6 = std::
                                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ::operator[](&this->orientation,(long)x_1);
                        sVar5 = std::vector<long,_std::allocator<long>_>::size(pvVar6);
                        if (sVar5 <= (ulong)(long)__range10._4_4_) break;
                        pvVar6 = std::
                                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ::operator[](&this->orientation,(long)x_1);
                        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                           (pvVar6,(long)__range10._4_4_);
                        if (*pvVar7 == 0) {
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_7,
                                              (long)(x_1 + 1));
                          *pvVar7 = *pvVar7 + 1;
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_7,
                                              (long)__range10._4_4_);
                          *pvVar7 = *pvVar7 + -1;
                        }
                        else {
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_7,
                                              (long)(x_1 + 1));
                          *pvVar7 = *pvVar7 + -1;
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_7,
                                              (long)__range10._4_4_);
                          *pvVar7 = *pvVar7 + 1;
                        }
                        __range10._4_4_ = __range10._4_4_ + 1;
                      }
                    }
                    __range10._0_4_ = 0;
                    __end10 = std::vector<long,_std::allocator<long>_>::begin
                                        ((vector<long,_std::allocator<long>_> *)&i_7);
                    i_8 = (long)std::vector<long,_std::allocator<long>_>::end
                                          ((vector<long,_std::allocator<long>_> *)&i_7);
                    while (bVar2 = __gnu_cxx::operator!=
                                             (&__end10,(
                                                  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                                  *)&i_8), bVar2) {
                      plVar8 = __gnu_cxx::
                               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               ::operator*(&__end10);
                      _i_9 = *plVar8;
                      dVar17 = pow((double)_i_9,2.0);
                      __range10._0_4_ = (int)((double)(int)__range10 + dVar17);
                      __gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator++(&__end10);
                    }
                    local_124 = 0.0;
                    for (local_128 = 1;
                        sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->boundary),
                        plVar1 = degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                        (ulong)(long)local_128 < sVar5; local_128 = local_128 + 1) {
                      iVar4 = dimension(this);
                      pvVar10 = std::
                                vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                              *)plVar1,iVar4 - 1);
                      psVar11 = (size_type *)
                                std::vector<long,_std::allocator<long>_>::operator[]
                                          (&this->boundary,(long)local_128);
                      pvVar12 = std::
                                vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                ::operator[](pvVar10,*psVar11);
                      degrees_2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = filtration(pvVar12);
                      pfVar14 = std::max<float>(&local_124,
                                                (float *)((long)&degrees_2.
                                                                                                                                  
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                      local_124 = *pfVar14;
                    }
                    this->filt = (float)(int)((float)(int)__range10 + local_124);
                    std::vector<long,_std::allocator<long>_>::~vector
                              ((vector<long,_std::allocator<long>_> *)&i_7);
                  }
                }
              }
              else {
                iVar3 = strcmp(filter,"natural-max");
                if (iVar3 != 0) {
                  this_00 = std::operator<<((ostream *)&std::cout,
                                            "Error no matching filtration found, aborting.");
                  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                  exit(-1);
                }
                iVar4 = dimension(this);
                if (iVar4 == 0) {
                  this->filt = 0.0;
                }
                else {
                  iVar4 = dimension(this);
                  if (iVar4 == 1) {
                    this->filt = 2.0;
                  }
                  else {
                    sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->vertices);
                    std::allocator<long>::allocator((allocator<long> *)((long)&j_2 + 3));
                    std::vector<long,_std::allocator<long>_>::vector
                              ((vector<long,_std::allocator<long>_> *)&i_10,sVar5,
                               (allocator<long> *)((long)&j_2 + 3));
                    std::allocator<long>::~allocator((allocator<long> *)((long)&j_2 + 3));
                    for (x_2 = 0; uVar13 = (ulong)x_2,
                        sVar5 = std::
                                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                ::size(&this->orientation), uVar13 < sVar5; x_2 = x_2 + 1) {
                      __range11._4_4_ = 0;
                      while( true ) {
                        uVar13 = (ulong)__range11._4_4_;
                        pvVar6 = std::
                                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ::operator[](&this->orientation,(long)x_2);
                        sVar5 = std::vector<long,_std::allocator<long>_>::size(pvVar6);
                        if (sVar5 <= uVar13) break;
                        pvVar6 = std::
                                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ::operator[](&this->orientation,(long)x_2);
                        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                           (pvVar6,(long)__range11._4_4_);
                        if (*pvVar7 == 0) {
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_10,
                                              (long)(x_2 + 1));
                          *pvVar7 = *pvVar7 + 1;
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_10,
                                              (long)__range11._4_4_);
                          *pvVar7 = *pvVar7 + -1;
                        }
                        else {
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_10,
                                              (long)(x_2 + 1));
                          *pvVar7 = *pvVar7 + -1;
                          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                             ((vector<long,_std::allocator<long>_> *)&i_10,
                                              (long)__range11._4_4_);
                          *pvVar7 = *pvVar7 + 1;
                        }
                        __range11._4_4_ = __range11._4_4_ + 1;
                      }
                    }
                    __range11._0_4_ = 0;
                    __end11 = std::vector<long,_std::allocator<long>_>::begin
                                        ((vector<long,_std::allocator<long>_> *)&i_10);
                    i_11 = (long)std::vector<long,_std::allocator<long>_>::end
                                           ((vector<long,_std::allocator<long>_> *)&i_10);
                    while (bVar2 = __gnu_cxx::operator!=
                                             (&__end11,(
                                                  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                                  *)&i_11), bVar2) {
                      plVar8 = __gnu_cxx::
                               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               ::operator*(&__end11);
                      _i_12 = *plVar8;
                      dVar17 = pow((double)_i_12,2.0);
                      __range11._0_4_ = (int)((double)(int)__range11 + dVar17);
                      __gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator++(&__end11);
                    }
                    local_17c = 0.0;
                    for (local_180 = 1; uVar13 = (ulong)local_180,
                        sVar5 = std::vector<long,_std::allocator<long>_>::size(&this->boundary),
                        plVar1 = degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage, uVar13 < sVar5;
                        local_180 = local_180 + 1) {
                      iVar4 = dimension(this);
                      pvVar10 = std::
                                vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                ::operator[]((vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                              *)plVar1,iVar4 - 1);
                      psVar11 = (size_type *)
                                std::vector<long,_std::allocator<long>_>::operator[]
                                          (&this->boundary,(long)local_180);
                      pvVar12 = std::
                                vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                ::operator[](pvVar10,*psVar11);
                      local_184 = filtration(pvVar12);
                      pfVar14 = std::max<float>(&local_17c,&local_184);
                      local_17c = *pfVar14;
                    }
                    local_188 = (int)local_17c;
                    piVar15 = std::max<int>((int *)&__range11,&local_188);
                    this->filt = (float)*piVar15;
                    std::vector<long,_std::allocator<long>_>::~vector
                              ((vector<long,_std::allocator<long>_> *)&i_10);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void delta_complex_cell_t::assign_filtration(const char* filter,delta_complex_t* complex){
	if(strcmp(filter,"local") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			int n = dimension();
			x += ((n+1)*n*(n-1)/3);
			filt = x;
		}
	} else if(strcmp(filter,"global") == 0){
		if(dimension() == 0){
			value_t m = 0;
			for( auto i : in_or_out ){
				if( i.second == 0 ) { m += 1; }
				else if( i.second == 1 ) { m -= 1; }
			}
			filt = pow(m,2);
		} else if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexMax") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[0][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"edgeMax") == 0){
		if(dimension() > 1){
			value_t m = complex->cells[1][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[1][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexSum") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"3cycle") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 0; }
		else{
            this->assign_filtration("local",complex);
            int n = dimension()+1;
			filt = (binom(n,3)*((4*n-2)/(n-2)) - filt)/8;
		}
    }else if(strcmp(filter,"natural") == 0){
        if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
			x += max_face;
			filt = x;
		}
    }else if(strcmp(filter,"natural-max") == 0){
        if(dimension() == 0){ filt = 0; }
        else if(dimension() == 1){ filt = 2; }
        else{
            std::vector<index_t> degrees(vertices.size());
            for(int i = 0; i < orientation.size(); i++){
                for(int j = 0; j < orientation[i].size(); j++){
                    if(orientation[i][j] == 0){
                        degrees[i+1]++;
                        degrees[j]--;
                    }
                    else{
                       degrees[i+1]--;
                       degrees[j]++;
                    }
                }
            }
            int x = 0;
            for(auto i : degrees){ x += pow(i,2); }
            value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
            filt = std::max(x,(int)max_face);
        }
	} else{
		std::cout << "Error no matching filtration found, aborting." << std::endl;
		exit(-1);
	}
}